

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

DecodeRawTransactionTxOutStruct * __thiscall
cfd::js::api::json::DecodeRawTransactionTxOut::ConvertToStruct
          (DecodeRawTransactionTxOutStruct *__return_storage_ptr__,DecodeRawTransactionTxOut *this)

{
  DecodeLockingScriptStruct DStack_c8;
  
  DecodeRawTransactionTxOutStruct::DecodeRawTransactionTxOutStruct(__return_storage_ptr__);
  __return_storage_ptr__->value = this->value_;
  __return_storage_ptr__->n = this->n_;
  DecodeLockingScript::ConvertToStruct(&DStack_c8,&this->script_pub_key_);
  DecodeLockingScriptStruct::operator=(&__return_storage_ptr__->script_pub_key,&DStack_c8);
  DecodeLockingScriptStruct::~DecodeLockingScriptStruct(&DStack_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodeRawTransactionTxOutStruct DecodeRawTransactionTxOut::ConvertToStruct() const {  // NOLINT
  DecodeRawTransactionTxOutStruct result;
  result.value = value_;
  result.n = n_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}